

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_window.c
# Opt level: O0

void fft_pitch_shift(fft_window_data *data,void *user)

{
  float fVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  float fVar6;
  double dVar7;
  double __x;
  undefined8 uStack_100;
  double local_f8;
  double local_f0;
  long local_e8;
  long local_e0;
  void *local_d8;
  void *local_d0;
  uint local_c4;
  float local_c0;
  uint32_t k_3;
  float phase_1;
  float tmp_1;
  float magnitude_1;
  uint32_t k_2;
  uint32_t index;
  uint32_t k_1;
  long qpd;
  float local_98;
  float tmp;
  float phase;
  float magnitude;
  float imag;
  float real;
  uint32_t k;
  float pitch_shift;
  double expected;
  double bin_frequencies;
  ulong uStack_68;
  uint32_t step;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  float *local_40;
  float *phase_sum;
  float *last_phase;
  float *fft_workspace;
  uint local_20;
  uint32_t framesize2;
  uint32_t oversampling;
  uint32_t framesize;
  void *user_local;
  fft_window_data *data_local;
  
  __vla_expr0 = (unsigned_long)&local_f8;
  framesize2 = (uint32_t)data->framesize;
  local_20 = (uint)data->oversampling;
  fft_workspace._4_4_ = (float)(framesize2 >> 1);
  last_phase = data->fft_workspace;
  phase_sum = data->last_phase;
  local_40 = data->phase_sum;
  __vla_expr1 = (unsigned_long)framesize2;
  local_e8 = (long)&local_f8 - (__vla_expr1 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr2 = (unsigned_long)framesize2;
  local_e0 = local_e8 - (__vla_expr2 * 4 + 0xf & 0xfffffffffffffff0);
  __vla_expr3 = (unsigned_long)framesize2;
  local_d8 = (void *)(local_e0 - (__vla_expr3 * 4 + 0xf & 0xfffffffffffffff0));
  uStack_68 = (ulong)framesize2;
  pvVar5 = (void *)((long)local_d8 - (uStack_68 * 4 + 0xf & 0xfffffffffffffff0));
  bin_frequencies._4_4_ = framesize2 / local_20;
  expected = (double)data->samplerate / (double)framesize2;
  _k = ((double)bin_frequencies._4_4_ * 6.283185307179586) / (double)framesize2;
  real = *user;
  local_d0 = pvVar5;
  _oversampling = user;
  user_local = data;
  for (imag = 0.0; pvVar2 = local_d0, (uint)imag <= (uint)fft_workspace._4_4_;
      imag = (float)((int)imag + 1)) {
    magnitude = last_phase[(uint)((int)imag * 2)];
    phase = last_phase[(ulong)(uint)((int)imag * 2) + 1];
    fVar6 = phase * phase;
    fVar1 = magnitude * magnitude;
    *(undefined8 *)((long)pvVar5 + -8) = 0x1c30e5;
    dVar7 = sqrt((double)(fVar1 + fVar6));
    tmp = (float)(dVar7 + dVar7);
    dVar7 = (double)phase;
    __x = (double)magnitude;
    *(undefined8 *)((long)pvVar5 + -8) = 0x1c3112;
    dVar7 = atan2(dVar7,__x);
    local_98 = (float)dVar7;
    fVar6 = phase_sum[(uint)imag];
    phase_sum[(uint)imag] = local_98;
    fVar6 = (float)(-(double)(uint)imag * _k + (double)(local_98 - fVar6));
    uVar3 = (ulong)(fVar6 / 3.1415927);
    if ((long)uVar3 < 0) {
      uVar4 = -(uVar3 & 1);
    }
    else {
      uVar4 = uVar3 & 1;
    }
    _index = uVar4 + uVar3;
    qpd._4_4_ = (float)((double)(uint)imag * expected +
                       (double)(((float)local_20 *
                                (float)((double)_index * -3.141592653589793 + (double)fVar6)) /
                               6.2831855) * expected);
    *(float *)(local_e0 + (ulong)(uint)imag * 4) = tmp;
    *(float *)(local_e8 + (ulong)(uint)imag * 4) = qpd._4_4_;
  }
  uVar3 = (ulong)framesize2;
  *(undefined8 *)((long)pvVar5 + -8) = 0x1c32e5;
  memset(pvVar2,0,uVar3 << 2);
  pvVar2 = local_d8;
  uVar3 = (ulong)framesize2;
  *(undefined8 *)((long)pvVar5 + -8) = 0x1c32fc;
  memset(pvVar2,0,uVar3 << 2);
  for (k_2 = 0; k_2 <= (uint)fft_workspace._4_4_; k_2 = k_2 + 1) {
    uVar3 = (ulong)((float)k_2 * real);
    magnitude_1 = (float)uVar3;
    if ((uint)magnitude_1 <= (uint)fft_workspace._4_4_) {
      *(float *)((long)local_d0 + (uVar3 & 0xffffffff) * 4) =
           *(float *)(local_e0 + (ulong)k_2 * 4) +
           *(float *)((long)local_d0 + (uVar3 & 0xffffffff) * 4);
      *(float *)((long)local_d8 + (uVar3 & 0xffffffff) * 4) =
           *(float *)(local_e8 + (ulong)k_2 * 4) * real;
    }
  }
  for (tmp_1 = 0.0; (uint)tmp_1 <= (uint)fft_workspace._4_4_; tmp_1 = (float)((int)tmp_1 + 1)) {
    phase_1 = *(float *)((long)local_d0 + (ulong)(uint)tmp_1 * 4);
    k_3 = (uint32_t)
          (float)((double)(uint)tmp_1 * _k +
                 (double)(((float)((double)(float)((double)*(float *)((long)local_d8 +
                                                                     (ulong)(uint)tmp_1 * 4) -
                                                  (double)(uint)tmp_1 * expected) / expected) *
                          6.2831855) / (float)local_20));
    local_40[(uint)tmp_1] = (float)k_3 + local_40[(uint)tmp_1];
    local_c0 = local_40[(uint)tmp_1];
    local_f8 = (double)phase_1;
    dVar7 = (double)local_c0;
    *(undefined8 *)((long)pvVar5 + -8) = 0x1c34fd;
    dVar7 = cos(dVar7);
    last_phase[(uint)((int)tmp_1 << 1)] = (float)(local_f8 * dVar7);
    local_f0 = (double)phase_1;
    dVar7 = (double)local_c0;
    *(undefined8 *)((long)pvVar5 + -8) = 0x1c3549;
    dVar7 = sin(dVar7);
    last_phase[(int)tmp_1 * 2 + 1] = (float)(local_f0 * dVar7);
  }
  for (local_c4 = framesize2 + 2; local_c4 < framesize2 << 1; local_c4 = local_c4 + 1) {
    last_phase[local_c4] = 0.0;
  }
  return;
}

Assistant:

VECTORIZE void fft_pitch_shift(struct fft_window_data *data, void *user){
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  uint32_t framesize2 = framesize/2;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->last_phase;
  float *restrict phase_sum = data->phase_sum;
  float analyzed_frequency[framesize];
  float analyzed_magnitude[framesize];
  float synthesized_frequency[framesize];
  float synthesized_magnitude[framesize];

  uint32_t step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  float pitch_shift = *((float*)user);

  for(uint32_t k = 0; k <= framesize2; k++){
    float real = fft_workspace[2*k];
    float imag = fft_workspace[2*k+1];

    float magnitude = 2.*sqrt(real*real + imag*imag);
    float phase = atan2(imag,real);
    float tmp = phase - last_phase[k];
    last_phase[k] = phase;
    tmp -= (double)k*expected;
    long qpd = tmp/M_PI;
    if (qpd >= 0) qpd += qpd&1;
    else qpd -= qpd&1;
    tmp -= M_PI*(double)qpd;
    tmp = oversampling*tmp/(2.*M_PI);
    tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

    analyzed_magnitude[k] = magnitude;
    analyzed_frequency[k] = tmp;
  }

  memset(synthesized_magnitude, 0, framesize*sizeof(float));
  memset(synthesized_frequency, 0, framesize*sizeof(float));
  for(uint32_t k = 0; k <= framesize2; k++){
    uint32_t index = k*pitch_shift;
    if(index <= framesize2){
      synthesized_magnitude[index] += analyzed_magnitude[k];
      synthesized_frequency[index] = analyzed_frequency[k] * pitch_shift;
    }
  }

  for(uint32_t k = 0; k <= framesize2; k++){
    float magnitude = synthesized_magnitude[k];
    float tmp = synthesized_frequency[k];

    tmp -= (double)k*bin_frequencies;
    tmp /= bin_frequencies;
    tmp = 2.*M_PI*tmp/oversampling;
    tmp += (double)k*expected;
    phase_sum[k] += tmp;

    float phase = phase_sum[k];
    fft_workspace[2*k] = magnitude*cos(phase);
    fft_workspace[2*k+1] = magnitude*sin(phase);
  }

  for(uint32_t k = framesize+2; k < 2*framesize; k++)
    fft_workspace[k] = 0.;
}